

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract
               (data_view *data,DataType baseType,vector<double,_std::allocator<double>_> *val)

{
  pointer pdVar1;
  pointer pdVar2;
  string_view val_00;
  uint *puVar3;
  data_view *data_00;
  vector<double,_std::allocator<double>_> *__args;
  iterator iVar4;
  ulong uVar5;
  _Uninitialized<double,_true> _Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  string_view val_01;
  double val_1;
  vector<double,_std::allocator<double>_> local_78;
  undefined1 local_58 [32];
  double local_38 [2];
  helics *local_28;
  
  __args = &local_78;
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar3 = &switchD_0025e9c1::switchdataD_0041656c;
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_58);
    _Var6._M_storage = (double)local_58._0_8_;
    break;
  case HELICS_INT:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_58);
    _Var6._M_storage = (double)(double)(long)local_58._0_8_;
    break;
  case HELICS_COMPLEX:
    local_58._0_8_ = 0.0;
    local_58._8_8_ = (helics *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_58);
    iVar4._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      local_28 = (helics *)local_58._8_8_;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar4,(double *)local_58);
      local_58._0_8_ = local_28;
    }
    else {
      *iVar4._M_current = (double)local_58._0_8_;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current + 1;
      local_58._0_8_ = local_58._8_8_;
    }
    if (((double)local_58._0_8_ == 0.0) && (!NAN((double)local_58._0_8_))) {
      return;
    }
    iVar4._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_0025ec7d:
      __args = (vector<double,_std::allocator<double>_> *)local_58;
      goto LAB_0025ec82;
    }
    *iVar4._M_current = (double)local_58._0_8_;
    goto LAB_0025eb31;
  case HELICS_VECTOR:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,val);
    return;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_58,data)
    ;
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(local_58._8_8_ - local_58._0_8_) >> 4);
    for (_Var6._M_storage = (double)local_58._0_8_; _Var6._M_storage != (double)local_58._8_8_;
        _Var6._M_storage = _Var6._M_storage + 0x10) {
      if ((*(double *)((long)_Var6._M_storage + 8) != 0.0) ||
         (NAN(*(double *)((long)_Var6._M_storage + 8)))) {
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)cabs(*_Var6._M_storage);
        uVar7 = SUB84(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,0);
        uVar8 = (undefined4)
                ((ulong)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 0x20);
        iVar4._M_current =
             (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current !=
            (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0025ebc3;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (val,iVar4,(double *)&local_78);
      }
      else {
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = *(pointer *)_Var6._M_storage;
        uVar7 = SUB84(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,0);
        uVar8 = (undefined4)
                ((ulong)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 0x20);
        iVar4._M_current =
             (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (val,iVar4,(double *)&local_78);
        }
        else {
LAB_0025ebc3:
          *iVar4._M_current = (double)CONCAT44(uVar8,uVar7);
          (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_finish = iVar4._M_current + 1;
        }
      }
    }
    if ((helics *)local_58._0_8_ == (helics *)0x0) {
      return;
    }
    uVar5 = local_58._16_8_ - local_58._0_8_;
    goto LAB_0025ecaf;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_58,data);
    if (NAN(local_38[0])) {
      val_01._M_str = (char *)puVar3;
      val_01._M_len = local_58._0_8_;
      helicsGetVector(&local_78,(helics *)local_58._8_8_,val_01);
      pdVar1 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pdVar1 != (pointer)0x0) &&
         (operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1),
         (helics *)
         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start != (helics *)0x0)) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      iVar4._M_current =
           (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)val,iVar4,local_38);
      }
      else {
        *iVar4._M_current = local_38[0];
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
    }
    if (local_58._0_8_ == (long)local_58 + 0x10) {
      return;
    }
    uVar5 = local_58._16_8_ + 1;
LAB_0025ecaf:
    operator_delete((void *)local_58._0_8_,uVar5);
    return;
  case HELICS_BOOL:
    goto switchD_0025e9c1_caseD_7;
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_58);
    _Var6._M_storage =
         (double)((long)local_58._0_8_ % 1000000000) * 1e-09 +
         (double)((long)local_58._0_8_ / 1000000000);
    iVar4._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_58._0_8_ = _Var6._M_storage;
    if (iVar4._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0025ec7d;
    goto LAB_0025eb2d;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_58,(helics *)data,data_00);
      valueExtract((defV *)local_58,val);
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_58);
      return;
    }
    goto switchD_0025e9c1_caseD_7;
  }
  iVar4._M_current =
       (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)_Var6._M_storage;
  if (iVar4._M_current ==
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
LAB_0025ec82:
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (val,iVar4,(double *)__args);
  }
  else {
LAB_0025eb2d:
    *iVar4._M_current = _Var6._M_storage;
LAB_0025eb31:
    (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
switchD_0025e9c1_caseD_7:
  local_58._0_8_ = 0.0;
  local_58._8_8_ = (char *)0x0;
  detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_58);
  val_00._M_str = (char *)local_58._8_8_;
  val_00._M_len = local_58._0_8_;
  helicsGetVector(val_00,val);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<double>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.push_back(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT: {
            val.push_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)));
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.push_back(static_cast<double>(time));
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetVector(npval.name);
            } else {
                val.push_back(npval.value);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            ValueConverter<std::vector<double>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val.reserve(cvec.size());
            for (auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}